

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_certificate_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ParsedCertificateTest_KeyUsage_Test::TestBody
          (ParsedCertificateTest_KeyUsage_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  uint8_t kExpectedBytes [1];
  shared_ptr<const_bssl::ParsedCertificate> cert;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  AssertHelper local_68;
  Input local_60;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 local_29;
  long lStack_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  local_50 = (undefined1  [8])&local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"key_usage.pem","");
  local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffffffffff00);
  ParseCertificateFromFile
            ((anon_unknown_0 *)&lStack_28,(string *)local_50,(ParseCertificateOptions *)local_78);
  if (local_50 != (undefined1  [8])&local_40) {
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
  }
  auVar1 = local_78;
  local_78[0] = lStack_28 != 0;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (lStack_28 == 0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_78,(AssertionResult *)0x5ab4af,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
               ,0x102,(char *)local_50);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
  }
  else {
    local_78[0] = *(char *)(lStack_28 + 0x15c);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (*(char *)(lStack_28 + 0x15c) == '\0') {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_50,(internal *)local_78,(AssertionResult *)"cert->has_key_usage()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                 ,0x104,(char *)local_50);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    }
    else {
      local_78._4_4_ = auVar1._4_4_;
      local_78._0_4_ = 5;
      if (*(char *)(lStack_28 + 0x15c) == '\0') {
LAB_00295065:
        abort();
      }
      local_60.data_.data_ =
           (uchar *)CONCAT71(local_60.data_.data_._1_7_,*(undefined1 *)(lStack_28 + 0x170));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_char>
                ((internal *)local_50,"5u","cert->key_usage().unused_bits()",(uint *)local_78,
                 (uchar *)&local_60);
      if (local_50[0] == (string)0x0) {
        testing::Message::Message((Message *)local_78);
        if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_48->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x106,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if (local_78 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_78 + 8))();
        }
      }
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
      local_78 = (undefined1  [8])&local_29;
      local_29 = 0xa0;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      if (*(char *)(lStack_28 + 0x15c) == '\0') goto LAB_00295065;
      local_60.data_.data_ = *(uchar **)(lStack_28 + 0x160);
      local_60.data_.size_ = *(size_t *)(lStack_28 + 0x168);
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)local_50,"der::Input(kExpectedBytes)","cert->key_usage().bytes()",
                 (Input *)local_78,&local_60);
      if (local_50[0] == (string)0x0) {
        testing::Message::Message((Message *)local_78);
        if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_48->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x108,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )local_78 !=
            (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )0x0) {
          (**(code **)(*(long *)local_78 + 8))();
        }
      }
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
      if (*(char *)(lStack_28 + 0x15c) == '\0') goto LAB_00295065;
      bVar2 = bssl::der::BitString::AssertsBit((BitString *)(lStack_28 + 0x160),0);
      local_78[0] = bVar2;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_78,
                   (AssertionResult *)"cert->key_usage().AssertsBit(0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x10a,(char *)local_50);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_50 != (undefined1  [8])&local_40) {
          operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
        }
        if ((long *)local_60.data_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_60.data_.data_ + 8))();
        }
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      if (*(char *)(lStack_28 + 0x15c) == '\0') goto LAB_00295065;
      bVar2 = bssl::der::BitString::AssertsBit((BitString *)(lStack_28 + 0x160),1);
      local_78[0] = !bVar2;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_50,(internal *)local_78,
                   (AssertionResult *)"cert->key_usage().AssertsBit(1)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x10b,(char *)local_50);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_50 != (undefined1  [8])&local_40) {
          operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
        }
        if ((long *)local_60.data_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_60.data_.data_ + 8))();
        }
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      if (*(char *)(lStack_28 + 0x15c) == '\0') goto LAB_00295065;
      bVar2 = bssl::der::BitString::AssertsBit((BitString *)(lStack_28 + 0x160),2);
      local_78[0] = bVar2;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2) goto LAB_0029503a;
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_50,(internal *)local_78,
                 (AssertionResult *)"cert->key_usage().AssertsBit(2)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                 ,0x10c,(char *)local_50);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_50 != (undefined1  [8])&local_40) {
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
  }
  if ((long *)local_60.data_.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_60.data_.data_ + 8))();
  }
LAB_0029503a:
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(ParsedCertificateTest, SubjectBlankSubjectAltNameNotCritical) {
  ASSERT_FALSE(ParseCertificateFromFile(
      "subject_blank_subjectaltname_not_critical.pem", {}));
}